

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall r_code::SysView::trace(SysView *this)

{
  pointer pAVar1;
  pointer puVar2;
  ostream *poVar3;
  Atom *atom;
  pointer this_00;
  pointer puVar4;
  
  poVar3 = std::operator<<((ostream *)&std::cout," code size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout," reference set size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"---code---");
  std::endl<char,std::char_traits<char>>(poVar3);
  pAVar1 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_ImageObject).code.m_vector.
                 super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pAVar1; this_00 = this_00 + 1) {
    Atom::trace(this_00);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"---reference set---");
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar2 = (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (this->super_ImageObject).references.m_vector.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void SysView::trace()
{
    std::cout << " code size: " << code.size() << std::endl;
    std::cout << " reference set size: " << references.size() << std::endl;
    std::cout << "---code---" << std::endl;

    for (const Atom &atom : code) {
        atom.trace();
        std::cout << std::endl;
    }

    std::cout << "---reference set---" << std::endl;

    for (uint32_t reference : references) {
        std::cout << reference << std::endl;
    }
}